

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O1

void p_glow2(obj *otmp,char *color)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar1 = xname(otmp);
  if ((u.uprops[0x1e].intrinsic == 0) &&
     (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
      (((youmonst.data)->mflags1 & 0x1000) == 0)))) {
    pcVar2 = "glow";
  }
  else if (ublindf == (obj *)0x0) {
    pcVar2 = "vibrate";
  }
  else {
    pcVar2 = "vibrate";
    if (ublindf->oartifact == '\x1d') {
      pcVar2 = "glow";
    }
  }
  pcVar2 = otense(otmp,pcVar2);
  if (((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
     (((youmonst.data)->mflags1 & 0x1000) == 0)) {
    pcVar4 = " ";
  }
  else if (ublindf == (obj *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = "";
    if (ublindf->oartifact == '\x1d') {
      pcVar4 = " ";
    }
  }
  if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
      (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
     ((pcVar3 = "", ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
    pcVar3 = hcolor(color);
  }
  pline("Your %s %s%s%s for a moment.",pcVar1,pcVar2,pcVar4,pcVar3);
  return;
}

Assistant:

static void p_glow2(struct obj *otmp, const char *color)
{
	pline("Your %s %s%s%s for a moment.",
		xname(otmp),
		otense(otmp, Blind ? "vibrate" : "glow"),
		Blind ? "" : " ",
		Blind ? nul : hcolor(color));
}